

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void write_u8_tick(Emulator *e,Address addr,u8 value)

{
  u8 value_local;
  Address addr_local;
  Emulator *e_local;
  
  tick(e);
  write_u8(e,addr,value);
  return;
}

Assistant:

static void write_u8_tick(Emulator* e, Address addr, u8 value) {
  tick(e);
  write_u8(e, addr, value);
}